

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O1

ztast_value_t * ztast_value_from_decimal(ztast_t *ast,int decimal)

{
  ztast_value_t *pzVar1;
  
  pzVar1 = (ztast_value_t *)(*ast->mallocfn)(8,ast->opaque);
  if (pzVar1 == (ztast_value_t *)0x0) {
    pzVar1 = (ztast_value_t *)0x0;
  }
  else {
    pzVar1->type = ZTVAL_DECIMAL;
    (pzVar1->data).integer = decimal;
  }
  return pzVar1;
}

Assistant:

ztast_value_t *ztast_value_from_decimal(ztast_t *ast, int decimal)
{
  ztast_value_t *val;

  assert(ast);

#ifdef ZTAST_LOG
  if (ast->logfn)
    ast->logfn("ztast_value_from_decimal\n");
#endif

  val = ZTAST_MALLOC(sizeof(*val));
  if (val == NULL)
    return NULL;

  val->type         = ZTVAL_DECIMAL;
  val->data.decimal = decimal;

  return val;
}